

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall
CDesign::GetWireInDirection
          (CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,
          vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iPos,int iDirection,int iMode,
          int iValue)

{
  CNet *this_00;
  int iVar1;
  uint uVar2;
  reference ppCVar3;
  size_type sVar4;
  CNet *pNet_1;
  int s_1;
  int i_1;
  CNet *pNet;
  int local_30;
  int s;
  int i;
  int iMode_local;
  int iDirection_local;
  int iPos_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *pWireList_local;
  vector<CNet_*,_std::allocator<CNet_*>_> *pNetList_local;
  CDesign *this_local;
  
  if ((iValue - 1U < 3) || (iValue == 0x30f)) {
    local_30 = 0;
    sVar4 = std::vector<CNet_*,_std::allocator<CNet_*>_>::size(pNetList);
    for (; local_30 < (int)sVar4; local_30 = local_30 + 1) {
      ppCVar3 = std::vector<CNet_*,_std::allocator<CNet_*>_>::at(pNetList,(long)local_30);
      CNet::GetWireInDirection(*ppCVar3,pWireList,iPos,iDirection,iMode,iValue);
    }
  }
  else if (iValue == 0x1000002) {
    pNet_1._4_4_ = 0;
    sVar4 = std::vector<CNet_*,_std::allocator<CNet_*>_>::size(pNetList);
    for (; pNet_1._4_4_ < (int)sVar4; pNet_1._4_4_ = pNet_1._4_4_ + 1) {
      ppCVar3 = std::vector<CNet_*,_std::allocator<CNet_*>_>::at(pNetList,(long)pNet_1._4_4_);
      this_00 = *ppCVar3;
      iVar1 = CNet::IsFlat(this_00);
      if ((iVar1 != 0) && (uVar2 = CObject::GetProp(&this_00->super_CObject), (uVar2 & 2) != 0)) {
        CNet::GetWireInDirection(this_00,pWireList,iPos,iDirection,0,0x30f);
      }
    }
  }
  sVar4 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  return (int)sVar4;
}

Assistant:

int CDesign::GetWireInDirection(vector<CNet*>* pNetList, vector<CWire*>* pWireList, int iPos, int iDirection, int iMode, int iValue)
{
	switch(iValue){
		case STATE_WIRE_ANY:
		case STATE_WIRE_ROUTED:
		case STATE_WIRE_UNROUTED:
		case PROP_WIRE_ANY:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				pNet->GetWireInDirection(pWireList,iPos,iDirection,iMode,iValue);
			}
			break;
		case PROP_NET_FLAT|PROP_NET_TWOPIN:
			for(int i=0,s=pNetList->size();i<s;i++)
			{
				CNet*	pNet	=	pNetList->at(i);
				if(pNet->IsFlat()&&pNet->GetProp()&PROP_NET_TWOPIN)
					pNet->GetWireInDirection(pWireList,iPos,iDirection);
			}
			break;
	}


	return	pWireList->size();
}